

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void lowmc_record_state(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,
                       recorded_state_t *state)

{
  uint32_t uVar1;
  lowmc_parameters_t *in_RDI;
  uint32_t lowmc_id;
  recorded_state_t *in_stack_00000038;
  mzd_local_t *in_stack_00000040;
  lowmc_key_t *in_stack_00000048;
  recorded_state_t *in_stack_000000b8;
  mzd_local_t *in_stack_000000c0;
  lowmc_key_t *in_stack_000000c8;
  recorded_state_t *in_stack_000000d8;
  mzd_local_t *in_stack_000000e0;
  lowmc_key_t *in_stack_000000e8;
  recorded_state_t *in_stack_000000f8;
  mzd_local_t *in_stack_00000100;
  lowmc_key_t *in_stack_00000108;
  
  uVar1 = lowmc_get_id(in_RDI);
  if (((DAT_0023b45c & 0x400) == 0x400) && ((DAT_0023b45c & 0x20000) == 0x20000)) {
    if (uVar1 == 0x80000a) {
      lowmc_store_s256_lowmc_128_128_20(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
      return;
    }
    if (uVar1 == 0x81002b) {
      lowmc_store_s256_lowmc_129_129_4(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      return;
    }
    if (uVar1 == 0xc0000a) {
      lowmc_store_s256_lowmc_192_192_30(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
      return;
    }
    if (uVar1 == 0xc00040) {
      lowmc_store_s256_lowmc_192_192_4(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      return;
    }
    if (uVar1 == 0xff0055) {
      lowmc_store_s256_lowmc_255_255_4(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      return;
    }
    if (uVar1 == 0x100000a) {
      lowmc_store_s256_lowmc_256_256_38(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
      return;
    }
  }
  if (uVar1 == 0x80000a) {
    lowmc_store_s128_lowmc_128_128_20(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  }
  else if (uVar1 == 0x81002b) {
    lowmc_store_s128_lowmc_129_129_4(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else if (uVar1 == 0xc0000a) {
    lowmc_store_s128_lowmc_192_192_30(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  }
  else if (uVar1 == 0xc00040) {
    lowmc_store_s128_lowmc_192_192_4(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else if (uVar1 == 0xff0055) {
    lowmc_store_s128_lowmc_255_255_4(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else {
    lowmc_store_s128_lowmc_256_256_38(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

void lowmc_record_state(const lowmc_parameters_t* lowmc, const lowmc_key_t* key,
                        const mzd_local_t* x, recorded_state_t* state) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s256_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s256_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s256_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s256_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s256_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s256_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s128_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s128_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s128_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s128_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s128_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s128_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
  case LOWMC_ID(128, 10):
    lowmc_store_uint64_lowmc_128_128_20(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_30)
  case LOWMC_ID(192, 10):
    lowmc_store_uint64_lowmc_192_192_30(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_256_256_38)
  case LOWMC_ID(256, 10):
    lowmc_store_uint64_lowmc_256_256_38(key, x, state);
    return;
#endif
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_store_uint64_lowmc_129_129_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_store_uint64_lowmc_192_192_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_store_uint64_lowmc_255_255_4(key, x, state);
    return;
#endif
  }
#endif

  UNREACHABLE;
}